

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O1

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,LogicalExpression *expression)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  SubtreeWrapper *pSVar4;
  SubtreeWrapper *second;
  RelativeConditionalWrapper *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstExpression *pCVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  psVar1 = &expression->operation_;
  if (&expression->lhs_->super_Node == (Node *)0x0) {
    if (expression->rhs_ == (Expression *)0x0) {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        this_00 = (RelativeConditionalWrapper *)operator_new(0x10);
        pCVar5 = (ConstExpression *)operator_new(0x10);
        IRT::ConstExpression::ConstExpression(pCVar5,1);
        IRT::ExpressionWrapper::ExpressionWrapper((ExpressionWrapper *)this_00,(Expression *)pCVar5)
        ;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 != 0) {
          return;
        }
        this_00 = (RelativeConditionalWrapper *)operator_new(0x10);
        pCVar5 = (ConstExpression *)operator_new(0x10);
        IRT::ConstExpression::ConstExpression(pCVar5,0);
        IRT::ExpressionWrapper::ExpressionWrapper((ExpressionWrapper *)this_00,(Expression *)pCVar5)
        ;
      }
    }
    else {
      pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &expression->rhs_->super_Node);
      this_00 = (RelativeConditionalWrapper *)operator_new(0x10);
      IRT::NegativeConditionalWrapper::NegativeConditionalWrapper
                ((NegativeConditionalWrapper *)this_00,pSVar4);
    }
  }
  else {
    pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->lhs_->super_Node);
    second = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      this_00 = (RelativeConditionalWrapper *)operator_new(0x18);
      IRT::AndConditionalWrapper::AndConditionalWrapper
                ((AndConditionalWrapper *)this_00,pSVar4,second);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        this_00 = (RelativeConditionalWrapper *)operator_new(0x18);
        IRT::OrConditionalWrapper::OrConditionalWrapper
                  ((OrConditionalWrapper *)this_00,pSVar4,second);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 == 0) {
          this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
          iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
          iVar3 = (*second->_vptr_SubtreeWrapper[2])(second);
          IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                    (this_00,EQ,(Expression *)CONCAT44(extraout_var_01,iVar2),
                     (Expression *)CONCAT44(extraout_var_02,iVar3));
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar2 == 0) {
            this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
            iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
            iVar3 = (*second->_vptr_SubtreeWrapper[2])(second);
            IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                      (this_00,GT,(Expression *)CONCAT44(extraout_var_03,iVar2),
                       (Expression *)CONCAT44(extraout_var_04,iVar3));
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar2 == 0) {
              this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
              iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
              iVar3 = (*second->_vptr_SubtreeWrapper[2])(second);
              IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                        (this_00,LT,(Expression *)CONCAT44(extraout_var_05,iVar2),
                         (Expression *)CONCAT44(extraout_var_06,iVar3));
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar2 == 0) {
                this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
                iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
                iVar3 = (*second->_vptr_SubtreeWrapper[2])(second);
                IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                          (this_00,GE,(Expression *)CONCAT44(extraout_var_07,iVar2),
                           (Expression *)CONCAT44(extraout_var_08,iVar3));
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar2 == 0) {
                  this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
                  iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
                  iVar3 = (*second->_vptr_SubtreeWrapper[2])(second);
                  IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                            (this_00,LE,(Expression *)CONCAT44(extraout_var_09,iVar2),
                             (Expression *)CONCAT44(extraout_var_10,iVar3));
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)psVar1);
                  if (iVar2 != 0) {
                    return;
                  }
                  this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
                  iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
                  iVar3 = (*second->_vptr_SubtreeWrapper[2])(second);
                  IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                            (this_00,NE,(Expression *)CONCAT44(extraout_var,iVar2),
                             (Expression *)CONCAT44(extraout_var_00,iVar3));
                }
              }
            }
          }
        }
      }
    }
  }
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(LogicalExpression* expression) {
  const std::string& op = expression->operation_;
  if (expression->lhs_ == nullptr && expression->rhs_ == nullptr) {
    if (op == "true") {
      tos_value_ = new IRT::ExpressionWrapper(new IRT::ConstExpression(1));
    } else if (op == "false") {
      tos_value_ = new IRT::ExpressionWrapper(new IRT::ConstExpression(0));
    }
  } else if (expression->lhs_ == nullptr) {
    auto wrapper = Accept(expression->rhs_);
    tos_value_ = new IRT::NegativeConditionalWrapper(wrapper);
  } else {
    auto lhs = Accept(expression->lhs_);
    auto rhs = Accept(expression->rhs_);

    if (op == "&&") {
      tos_value_ = new IRT::AndConditionalWrapper(lhs, rhs);
    } else if (op == "||") {
      tos_value_ = new IRT::OrConditionalWrapper(lhs, rhs);
    } else if (op == "==") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::EQ, lhs->ToExpression(), rhs->ToExpression());
    } else if (op == ">") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::GT, lhs->ToExpression(), rhs->ToExpression());
    } else if (op == "<") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::LT, lhs->ToExpression(), rhs->ToExpression());
    } else if (op == ">=") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::GE, lhs->ToExpression(), rhs->ToExpression()
          );
    } else if (op == "<=") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::LE, lhs->ToExpression(), rhs->ToExpression()
      );
    } else if (op == "!=") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::NE, lhs->ToExpression(), rhs->ToExpression()
      );
    }
  }
}